

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc)

{
  bool bVar1;
  string *psVar2;
  cmGlobalNinjaGenerator *pcVar3;
  string output;
  string input;
  string macdir;
  string sStack_98;
  string local_78;
  string local_58;
  string local_38;
  
  bVar1 = cmTarget::IsBundleOnApple(this->Generator->Target);
  if (bVar1) {
    cmOSXBundleGenerator::InitMacOSXContentDirectory_abi_cxx11_
              (&local_38,this->Generator->OSXBundleGenerator,pkgloc);
    psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    std::__cxx11::string::string((string *)&local_78,(string *)psVar2);
    cmLocalNinjaGenerator::ConvertToNinjaPath(&sStack_98,this->Generator->LocalGenerator,&local_78);
    std::__cxx11::string::operator=((string *)&local_78,(string *)&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
    std::__cxx11::string::string((string *)&sStack_98,(string *)&local_38);
    std::__cxx11::string::append((char *)&sStack_98);
    cmsys::SystemTools::GetFilenameName(&local_58,&local_78);
    std::__cxx11::string::append((string *)&sStack_98);
    std::__cxx11::string::~string((string *)&local_58);
    cmLocalNinjaGenerator::ConvertToNinjaPath(&local_58,this->Generator->LocalGenerator,&sStack_98);
    std::__cxx11::string::operator=((string *)&sStack_98,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    pcVar3 = GetGlobalGenerator(this->Generator);
    cmGlobalNinjaGenerator::WriteMacOSXContentBuild(pcVar3,&local_78,&sStack_98);
    pcVar3 = GetGlobalGenerator(this->Generator);
    cmGlobalNinjaGenerator::AddDependencyToAll(pcVar3,&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void
cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()(
  cmSourceFile const& source, const char* pkgloc)
{
  // Skip OS X content when not building a Framework or Bundle.
  if(!this->Generator->GetTarget()->IsBundleOnApple())
    {
    return;
    }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc);

  // Get the input file location.
  std::string input = source.GetFullPath();
  input =
    this->Generator->GetLocalGenerator()->ConvertToNinjaPath(input);

  // Get the output file location.
  std::string output = macdir;
  output += "/";
  output += cmSystemTools::GetFilenameName(input);
  output =
    this->Generator->GetLocalGenerator()->ConvertToNinjaPath(output);

  // Write a build statement to copy the content into the bundle.
  this->Generator->GetGlobalGenerator()->WriteMacOSXContentBuild(input,
                                                                 output);

  // Add as a dependency of all target so that it gets called.
  this->Generator->GetGlobalGenerator()->AddDependencyToAll(output);
}